

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_extract.hpp
# Opt level: O0

string * file_io::extract_content(string *__return_storage_ptr__,string *__file_path)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  ulong uVar5;
  byte local_33e;
  byte local_33b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  string _line;
  undefined1 local_278 [5];
  bool _content_start;
  bool _is_closing_tag_parse;
  bool _is_opening_tag_parse;
  regex _whitespace;
  istream local_228 [8];
  ifstream _input_file;
  string *__file_path_local;
  string *_output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(local_228,(string *)__file_path,_S_in);
  poVar3 = std::operator<<((ostream *)&std::cout,"Extracting content from: ");
  poVar3 = std::operator<<(poVar3,(string *)__file_path);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_whitespace._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,"Cannot open file at: ",__file_path);
    exit_error_code(3,(string *)
                      &_whitespace._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &_whitespace._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_278,"\\s+",0x10);
  _line.field_2._M_local_buf[0xf] = '\0';
  _line.field_2._M_local_buf[0xe] = '\0';
  _line.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string((string *)local_2a0);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_228,(string *)local_2a0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::string((string *)&local_2c0,(string *)local_2a0);
    bVar2 = is_frontmatter_tag(&local_2c0);
    local_33b = 0;
    if (bVar2) {
      local_33b = _line.field_2._M_local_buf[0xf] ^ 0xff;
    }
    std::__cxx11::string::~string((string *)&local_2c0);
    if ((local_33b & 1) == 0) {
      std::__cxx11::string::string((string *)&local_2e0,(string *)local_2a0);
      bVar2 = is_frontmatter_tag(&local_2e0);
      local_33e = 0;
      if ((bVar2) && (local_33e = 0, (_line.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_33e = _line.field_2._M_local_buf[0xe] ^ 0xff;
      }
      std::__cxx11::string::~string((string *)&local_2e0);
      if ((local_33e & 1) == 0) {
        if ((((_line.field_2._M_local_buf[0xf] & 1U) == 0) ||
            ((_line.field_2._M_local_buf[0xe] & 1U) != 0)) &&
           (((bVar2 = std::
                      regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2a0,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_278,0
                                ), !bVar2 &&
             (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) ||
            ((_line.field_2._M_local_buf[0xd] & 1U) != 0)))) {
          std::operator+(&local_300,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a0,"\n");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          _line.field_2._M_local_buf[0xd] = '\x01';
        }
      }
      else {
        _line.field_2._M_local_buf[0xe] = '\x01';
      }
    }
    else {
      _line.field_2._M_local_buf[0xf] = '\x01';
    }
  }
  std::__cxx11::string::~string((string *)local_2a0);
  std::ifstream::close();
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_278);
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string extract_content(std::string __file_path) {
        std::string _output;
        std::ifstream _input_file(__file_path);
        std::cout << "Extracting content from: " << __file_path << std::endl;
        if (!_input_file.is_open())
            exit_error_code(3, "Cannot open file at: " + __file_path);		

        std::regex _whitespace("\\s+");
        bool _is_opening_tag_parse = false, _is_closing_tag_parse = false, _content_start = false;
        for (std::string _line; std::getline(_input_file, _line);) {
            if (is_frontmatter_tag(_line) && !_is_opening_tag_parse)
                _is_opening_tag_parse = true;
            else if (is_frontmatter_tag(_line) && _is_opening_tag_parse && !_is_closing_tag_parse)
                _is_closing_tag_parse = true;
            else if ((_is_opening_tag_parse && !_is_closing_tag_parse) || ((regex_match(_line, _whitespace) || _line.empty()) && !_content_start))
                continue;
            else {
                _output += _line + "\n";
                _content_start = true;
            }
        }

        _input_file.close();
        return _output;
    }